

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O1

int __thiscall MemSizeCalculator::calculateVariable(MemSizeCalculator *this,Variable *variable)

{
  SymbolTable *this_00;
  int *piVar1;
  bool bVar2;
  int _size;
  Class *_class;
  vector<int,_std::allocator<int>_> *pvVar3;
  int *piVar4;
  string local_48;
  
  bVar2 = Variable::isTypeId(variable);
  if (bVar2) {
    this_00 = this->symbolTable;
    Variable::getRawType_abi_cxx11_(&local_48,variable);
    _class = Semantic::SymbolTable::getClass(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (_class->isMemSizeAlreadyCalculated == true) {
      _size = Class::getSize(_class);
    }
    else {
      _size = calculateClass(this,_class);
    }
  }
  else {
    _size = 4;
    if (variable->dimensions != 0) {
      pvVar3 = Variable::getArraySize(variable);
      piVar4 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar4 != piVar1) {
        _size = 4;
        do {
          _size = _size * *piVar4;
          piVar4 = piVar4 + 1;
        } while (piVar4 != piVar1);
      }
    }
    Variable::setSize(variable,_size);
  }
  return _size;
}

Assistant:

int MemSizeCalculator::calculateVariable(Variable *variable) {
    if (variable->isTypeId()) {
        auto classToCalculate = symbolTable->getClass(variable->getRawType());
        if (classToCalculate->isMemSizeAlreadyCalculated) return classToCalculate->getSize();
        else { return calculateClass(classToCalculate); }
    }
    int size = 4;
    if (variable->isArray())
        for (int _size : variable->getArraySize()) size *= _size;
    variable->setSize(size);
    return size;
}